

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall TestEncoding::testEncoding<int>(TestEncoding *this,int start,int stop)

{
  ostream *poVar1;
  int i;
  int iVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"testing from ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,start);
  poVar1 = std::operator<<(poVar1," to ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stop);
  std::operator<<(poVar1," inclusive\n");
  for (iVar2 = 0; iVar2 <= stop - start; iVar2 = iVar2 + 1) {
    compare(this,start + iVar2);
  }
  return;
}

Assistant:

void testEncoding(IntType start, IntType stop)
    {
        std::cout << "testing from " << start << " to " << stop << " inclusive\n";
        IntType val = start;
        IntType diff = stop - start + 1;

        for(IntType i = 0; i < diff; ++i) {
            compare(val+i);
        }
    }